

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

void highbd_quantize_fp_helper_c
               (tran_low_t *coeff_ptr,intptr_t count,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  short *in_RCX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  tran_low_t abs_dqcoeff_1;
  int abs_qcoeff_1;
  int64_t tmp_1;
  int dequant_1;
  int quant;
  int log_scaled_round;
  int abs_coeff_1;
  int coeff_sign_1;
  int rc01;
  int coeff_1;
  int rc_1;
  int log_scaled_round_arr [2];
  tran_low_t abs_dqcoeff;
  int64_t tmp;
  int abs_qcoeff;
  int64_t abs_coeff;
  int coeff_sign;
  int dequant;
  qm_val_t iwt;
  qm_val_t wt;
  int coeff;
  int rc;
  int shift;
  int eob;
  int i;
  
  tmp._0_4_ = -1;
  bVar4 = (byte)dequant_ptr;
  if ((qcoeff_ptr == (tran_low_t *)0x0) && (dqcoeff_ptr == (tran_low_t *)0x0)) {
    abs_qcoeff_1 = (int)*in_RCX + ((1 << (bVar4 & 0x1f)) >> 1) >> (bVar4 & 0x1f);
    tmp_1._0_4_ = (int)in_RCX[1] + ((1 << (bVar4 & 0x1f)) >> 1) >> (bVar4 & 0x1f);
    for (tmp._4_4_ = 0; tmp._4_4_ < in_RSI; tmp._4_4_ = tmp._4_4_ + 1) {
      iVar5 = (int)*(short *)((long)coeff_ptr + (long)tmp._4_4_ * 2);
      uVar7 = *(uint *)(in_RDI + (long)iVar5 * 4);
      uVar6 = (uint)(iVar5 != 0);
      uVar8 = 0;
      if ((int)uVar7 < 0) {
        uVar8 = 0xffffffff;
      }
      iVar9 = (uVar7 ^ uVar8) - uVar8;
      if (iVar9 << (bVar4 + 1 & 0x1f) < (int)zbin_ptr[(int)uVar6]) {
        (quant_ptr + (long)iVar5 * 2)[0] = 0;
        (quant_ptr + (long)iVar5 * 2)[1] = 0;
        (round_ptr + (long)iVar5 * 2)[0] = 0;
        (round_ptr + (long)iVar5 * 2)[1] = 0;
      }
      else {
        sVar3 = zbin_ptr[(int)uVar6];
        uVar7 = (uint)(((long)iVar9 + (long)(&abs_qcoeff_1)[(int)uVar6]) *
                       (long)(int)*(short *)(in_R8 + (long)(int)uVar6 * 2) >> (-bVar4 + 0x10 & 0x3f)
                      );
        *(uint *)(quant_ptr + (long)iVar5 * 2) = (uVar7 ^ uVar8) - uVar8;
        if (uVar7 != 0) {
          tmp._0_4_ = tmp._4_4_;
        }
        *(uint *)(round_ptr + (long)iVar5 * 2) =
             ((int)(uVar7 * (int)sVar3) >> (bVar4 & 0x1f) ^ uVar8) - uVar8;
      }
    }
  }
  else {
    for (tmp._4_4_ = 0; tmp._4_4_ < in_RSI; tmp._4_4_ = tmp._4_4_ + 1) {
      iVar5 = (int)*(short *)((long)coeff_ptr + (long)tmp._4_4_ * 2);
      uVar7 = *(uint *)(in_RDI + (long)iVar5 * 4);
      if (qcoeff_ptr == (tran_low_t *)0x0) {
        bVar1 = 0x20;
      }
      else {
        bVar1 = *(byte *)((long)qcoeff_ptr + (long)iVar5);
      }
      if (dqcoeff_ptr == (tran_low_t *)0x0) {
        bVar2 = 0x20;
      }
      else {
        bVar2 = *(byte *)((long)dqcoeff_ptr + (long)iVar5);
      }
      sVar3 = zbin_ptr[(int)(uint)(iVar5 != 0)];
      uVar6 = 0;
      if ((int)uVar7 < 0) {
        uVar6 = 0xffffffff;
      }
      lVar10 = (long)(int)((uVar7 ^ uVar6) - uVar6);
      if ((long)(lVar10 * (ulong)bVar1) <
          (long)((int)zbin_ptr[(int)(uint)(iVar5 != 0)] << (5 - (bVar4 + 1) & 0x1f))) {
        (quant_ptr + (long)iVar5 * 2)[0] = 0;
        (quant_ptr + (long)iVar5 * 2)[1] = 0;
        (round_ptr + (long)iVar5 * 2)[0] = 0;
        (round_ptr + (long)iVar5 * 2)[1] = 0;
      }
      else {
        uVar7 = (uint)((long)((lVar10 + ((int)in_RCX[(int)(uint)(iVar5 != 0)] +
                                         ((1 << (bVar4 & 0x1f)) >> 1) >> (bVar4 & 0x1f))) *
                              (long)*(short *)(in_R8 + (long)(int)(uint)(iVar5 != 0) * 2) *
                             (ulong)bVar1) >> (-bVar4 + 0x15 & 0x3f));
        *(uint *)(quant_ptr + (long)iVar5 * 2) = (uVar7 ^ uVar6) - uVar6;
        *(uint *)(round_ptr + (long)iVar5 * 2) =
             ((int)(uVar7 * ((int)((int)sVar3 * (uint)bVar2 + 0x10) >> 5)) >> (bVar4 & 0x1f) ^ uVar6
             ) - uVar6;
        if (uVar7 != 0) {
          tmp._0_4_ = tmp._4_4_;
        }
      }
    }
  }
  *(short *)count = (short)tmp + 1;
  return;
}

Assistant:

static void highbd_quantize_fp_helper_c(
    const tran_low_t *coeff_ptr, intptr_t count, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, const qm_val_t *qm_ptr,
    const qm_val_t *iqm_ptr, int log_scale) {
  int i;
  int eob = -1;
  const int shift = 16 - log_scale;
  // TODO(jingning) Decide the need of these arguments after the
  // quantization process is completed.
  (void)zbin_ptr;
  (void)quant_shift_ptr;
  (void)iscan;

  if (qm_ptr || iqm_ptr) {
    // Quantization pass: All coefficients with index >= zero_flag are
    // skippable. Note: zero_flag can be zero.
    for (i = 0; i < count; i++) {
      const int rc = scan[i];
      const int coeff = coeff_ptr[rc];
      const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
      const qm_val_t iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
      const int dequant =
          (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >>
          AOM_QM_BITS;
      const int coeff_sign = AOMSIGN(coeff);
      const int64_t abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      int abs_qcoeff = 0;
      if (abs_coeff * wt >=
          (dequant_ptr[rc != 0] << (AOM_QM_BITS - (1 + log_scale)))) {
        const int64_t tmp =
            abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale);
        abs_qcoeff =
            (int)((tmp * quant_ptr[rc != 0] * wt) >> (shift + AOM_QM_BITS));
        qcoeff_ptr[rc] = (tran_low_t)((abs_qcoeff ^ coeff_sign) - coeff_sign);
        const tran_low_t abs_dqcoeff = (abs_qcoeff * dequant) >> log_scale;
        dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);
        if (abs_qcoeff) eob = i;
      } else {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
      }
    }
  } else {
    const int log_scaled_round_arr[2] = {
      ROUND_POWER_OF_TWO(round_ptr[0], log_scale),
      ROUND_POWER_OF_TWO(round_ptr[1], log_scale),
    };
    for (i = 0; i < count; i++) {
      const int rc = scan[i];
      const int coeff = coeff_ptr[rc];
      const int rc01 = (rc != 0);
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int log_scaled_round = log_scaled_round_arr[rc01];
      if ((abs_coeff << (1 + log_scale)) >= dequant_ptr[rc01]) {
        const int quant = quant_ptr[rc01];
        const int dequant = dequant_ptr[rc01];
        const int64_t tmp = (int64_t)abs_coeff + log_scaled_round;
        const int abs_qcoeff = (int)((tmp * quant) >> shift);
        qcoeff_ptr[rc] = (tran_low_t)((abs_qcoeff ^ coeff_sign) - coeff_sign);
        const tran_low_t abs_dqcoeff = (abs_qcoeff * dequant) >> log_scale;
        if (abs_qcoeff) eob = i;
        dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);
      } else {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
      }
    }
  }
  *eob_ptr = eob + 1;
}